

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void * lua_newuserdata(lua_State *L,size_t size)

{
  StkId pTVar1;
  GCObject *pGVar2;
  
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  pGVar2 = (GCObject *)luaS_newudata(L,size,(Table *)0x0);
  pTVar1 = L->top;
  (pTVar1->value_).gc = pGVar2;
  pTVar1->tt_ = 0x47;
  L->top = L->top + 1;
  return &pGVar2->u + 1;
}

Assistant:

LUA_API void *lua_newuserdata (lua_State *L, size_t size) {
  Udata *u;
  lua_lock(L);
  luaC_checkGC(L);
  u = luaS_newudata(L, size, NULL);
  setuvalue(L, L->top, u);
  api_incr_top(L);
  lua_unlock(L);
  return u + 1;
}